

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRangeDynamicLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  int rank;
  bool bVar1;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  string local_48;
  
  Result::Result(__return_storage_ptr__);
  if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    validateInputCount((Result *)local_90,layer,0,0);
  }
  else {
    validateInputCount((Result *)local_90,layer,1,3);
  }
  __return_storage_ptr__->m_type = local_90._0_4_;
  __return_storage_ptr__->m_reason = local_90._4_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_message,(string *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
  }
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount((Result *)local_90,layer,1,1);
    __return_storage_ptr__->m_type = local_90._0_4_;
    __return_storage_ptr__->m_reason = local_90._4_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->m_message,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_p != &local_78) {
      operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
    }
  }
  if (0 < (layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_) {
    rank = *(int *)((long)((layer->outputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                   0x24);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Range","");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"output","");
    checkRank((Result *)local_90,layer,&local_48,1,1,&local_68,rank);
    __return_storage_ptr__->m_type = local_90._0_4_;
    __return_storage_ptr__->m_reason = local_90._4_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->m_message,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_p != &local_78) {
      operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRangeDynamicLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (layer.input_size() > 0) {
        r = validateInputCount(layer, 1, 3);
    } else {
        r = validateInputCount(layer, 0, 0);
    }
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (layer.outputtensor_size() > 0) {
        int rank = static_cast<int>(layer.outputtensor(0).rank());
        r =  checkRank(layer, "Range", 1, 1, "output", rank);
    }

    return r;
}